

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void anon_unknown.dwarf_f89de::ReplaceValueUsersWith
               (VmModule *module,VmValue *original,VmValue *replacement,uint *optCount)

{
  SmallArray<VmValue_*,_128U> *this;
  InplaceStr *this_00;
  TypeBase *pTVar1;
  VmValue **ppVVar2;
  VmBlock **ppVVar3;
  VmBlock *pVVar4;
  uint i;
  uint uVar5;
  
  if ((module->tempUsers).count == 0) {
    this = &module->tempUsers;
    SmallArray<VmValue_*,_128U>::reserve(this,(original->users).count);
    SmallArray<VmValue_*,_128U>::push_back(this,(original->users).data,(original->users).count);
    for (uVar5 = 0; uVar5 < (module->tempUsers).count; uVar5 = uVar5 + 1) {
      ppVVar2 = SmallArray<VmValue_*,_128U>::operator[](this,uVar5);
      ReplaceValue(module,*ppVVar2,original,replacement);
    }
    if ((original != (VmValue *)0x0) && (original->typeID == 3)) {
      pTVar1 = original[1].type.structType;
      this_00 = &pTVar1[3].name;
      for (uVar5 = 0; uVar5 < *(uint *)&pTVar1[3].name.end; uVar5 = uVar5 + 1) {
        ppVVar3 = SmallArray<VmBlock_*,_4U>::operator[]((SmallArray<VmBlock_*,_4U> *)this_00,uVar5);
        if (*ppVVar3 == (VmBlock *)original) {
          if ((replacement == (VmValue *)0x0) ||
             (pVVar4 = (VmBlock *)replacement, replacement->typeID != 3)) {
            pVVar4 = (VmBlock *)0x0;
          }
          ppVVar3 = SmallArray<VmBlock_*,_4U>::operator[]
                              ((SmallArray<VmBlock_*,_4U> *)this_00,uVar5);
          *ppVVar3 = pVVar4;
        }
      }
    }
    if (optCount != (uint *)0x0) {
      *optCount = *optCount + 1;
    }
    (module->tempUsers).count = 0;
    return;
  }
  __assert_fail("module->tempUsers.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x48e,
                "void (anonymous namespace)::ReplaceValueUsersWith(VmModule *, VmValue *, VmValue *, unsigned int *)"
               );
}

Assistant:

void ReplaceValueUsersWith(VmModule *module, VmValue *original, VmValue *replacement, unsigned *optCount)
	{
		assert(module->tempUsers.empty());

		module->tempUsers.reserve(original->users.size());
		module->tempUsers.push_back(original->users.data, original->users.size());

		for(unsigned i = 0; i < module->tempUsers.size(); i++)
			ReplaceValue(module, module->tempUsers[i], original, replacement);

		if(VmBlock *block = getType<VmBlock>(original))
		{
			VmFunction *function = block->parent;

			for(unsigned i = 0; i < function->restoreBlocks.size(); i++)
			{
				if(original == function->restoreBlocks[i])
					function->restoreBlocks[i] = getType<VmBlock>(replacement);
			}
		}

		if(optCount)
			(*optCount)++;

		module->tempUsers.clear();
	}